

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

bool anon_unknown.dwarf_2ff977::WindowsImplX11Impl::ewmhSupported(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  Atom AVar5;
  Atom AVar6;
  Display *display;
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  unsigned_long numItems;
  Atom actualType;
  int actualFormat;
  uchar *data;
  string local_60;
  Atom local_40;
  unsigned_long numBytes;
  
  bVar8 = (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::ewmhSupported;
  if ((anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::checked == '\x01')
  goto LAB_001976fe;
  (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::checked = '\x01';
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"_NET_SUPPORTING_WM_CHECK","")
  ;
  AVar5 = sf::priv::getAtom(&local_60,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"_NET_SUPPORTED","");
  AVar6 = sf::priv::getAtom(&local_60,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  bVar8 = 0;
  if ((AVar5 == 0) || (AVar6 == 0)) goto LAB_001976fe;
  display = sf::priv::OpenDisplay();
  iVar4 = XGetWindowProperty(display,*(undefined8 *)
                                      (*(long *)(display + 0xe8) + 0x10 +
                                      (long)*(int *)(display + 0xe0) * 0x80),AVar5,0,1,0,0x21,
                             &actualType,&actualFormat,&numItems,&numBytes,&data);
  if ((iVar4 == 0) && ((actualType == 0x21 && (numItems == 1)))) {
    lVar2 = *(long *)data;
    XFree();
    if (lVar2 != 0) {
      iVar4 = XGetWindowProperty(display,lVar2,AVar5,0,1,0,0x21,&actualType,&actualFormat,&numItems,
                                 &numBytes,&data);
      if (((iVar4 != 0) || (actualType != 0x21)) || (numItems != 1)) goto LAB_001976d9;
      lVar3 = *(long *)data;
      XFree();
      if (lVar2 != lVar3 || lVar3 == 0) goto LAB_001976f4;
      (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::ewmhSupported = 1;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"_NET_WM_NAME","");
      AVar5 = sf::priv::getAtom(&local_60,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if (AVar5 == 0) {
        bVar8 = 1;
        goto LAB_001976f6;
      }
      local_60._M_dataplus._M_p = (pointer)paVar1;
      local_40 = AVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"UTF8_STRING","");
      AVar5 = sf::priv::getAtom(&local_60,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      AVar6 = 0x1f;
      if (AVar5 != 0) {
        AVar6 = AVar5;
      }
      uVar7 = 0;
      iVar4 = XGetWindowProperty(display,lVar2,local_40,0,0x7fffffff,0,AVar6,&actualType,
                                 &actualFormat,&numItems,&numBytes,&data);
      if (actualType != 0 && numItems != 0) {
        sf::String::fromUtf8<char_const*>
                  ((String *)&local_60,(String *)data,(char *)(data + numItems),
                   (char *)CONCAT71((int7)((ulong)uVar7 >> 8),numItems != 0));
        sf::String::operator=
                  ((String *)(anonymous_namespace)::WindowsImplX11Impl::windowManagerName,
                   (String *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      bVar9 = 1;
      bVar8 = 1;
      goto joined_r0x001976e3;
    }
LAB_001976f4:
    bVar8 = 0;
  }
  else {
LAB_001976d9:
    bVar9 = 0;
    bVar8 = 0;
joined_r0x001976e3:
    if (iVar4 == 0) {
      XFree(data);
      bVar8 = bVar9;
    }
  }
LAB_001976f6:
  sf::priv::CloseDisplay(display);
LAB_001976fe:
  return (bool)(bVar8 & 1);
}

Assistant:

bool ewmhSupported()
        {
            static bool checked = false;
            static bool ewmhSupported = false;

            if (checked)
                return ewmhSupported;

            checked = true;

            Atom netSupportingWmCheck = sf::priv::getAtom("_NET_SUPPORTING_WM_CHECK", true);
            Atom netSupported = sf::priv::getAtom("_NET_SUPPORTED", true);

            if (!netSupportingWmCheck || !netSupported)
                return false;

            ::Display* display = sf::priv::OpenDisplay();

            Atom actualType;
            int actualFormat;
            unsigned long numItems;
            unsigned long numBytes;
            unsigned char* data;

            int result = XGetWindowProperty(display,
                                            DefaultRootWindow(display),
                                            netSupportingWmCheck,
                                            0,
                                            1,
                                            False,
                                            XA_WINDOW,
                                            &actualType,
                                            &actualFormat,
                                            &numItems,
                                            &numBytes,
                                            &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window rootWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!rootWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netSupportingWmCheck,
                                        0,
                                        1,
                                        False,
                                        XA_WINDOW,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window childWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            // Conforming window managers should return the same window for both queries
            if (rootWindow != childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            ewmhSupported = true;

            // We try to get the name of the window manager
            // for window manager specific workarounds
            Atom netWmName = sf::priv::getAtom("_NET_WM_NAME", true);

            if (!netWmName)
            {
                sf::priv::CloseDisplay(display);
                return true;
            }

            Atom utf8StringType = sf::priv::getAtom("UTF8_STRING");

            if (!utf8StringType)
                utf8StringType = XA_STRING;

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netWmName,
                                        0,
                                        0x7fffffff,
                                        False,
                                        utf8StringType,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (actualType && numItems)
            {
                // It seems the wm name string reply is not necessarily
                // null-terminated. The work around is to get its actual
                // length to build a proper string
                const char* begin = reinterpret_cast<const char*>(data);
                const char* end = begin + numItems;
                windowManagerName = sf::String::fromUtf8(begin, end);
            }

            if (result == Success)
                XFree(data);

            sf::priv::CloseDisplay(display);

            return true;
        }